

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_collection_exists(jx9_context *pCtx,int argc,jx9_value **argv)

{
  unqlite_vm *pVm;
  jx9_user_func *pjVar1;
  jx9_value *pObj;
  int iVar2;
  char *pcVar3;
  unqlite_col *puVar4;
  jx9_vm *pVm_00;
  jx9_real jVar5;
  int nByte;
  SyString sName;
  sxu32 local_3c;
  SyString local_38;
  
  if (argc < 1) {
    pjVar1 = pCtx->pFunc;
    pVm_00 = pCtx->pVm;
    pcVar3 = "Missing collection name";
  }
  else {
    pcVar3 = jx9_value_to_string(*argv,(int *)&local_3c);
    if (0 < (int)local_3c) {
      local_38.nByte = local_3c;
      pVm = (unqlite_vm *)pCtx->pFunc->pUserData;
      local_38.zString = pcVar3;
      puVar4 = unqliteVmFetchCollection(pVm,&local_38);
      jVar5 = 4.94065645841247e-324;
      if (puVar4 == (unqlite_col *)0x0) {
        iVar2 = unqliteVmLoadCollection(pVm,pcVar3,local_3c,2,(unqlite_col **)0x0);
        jVar5 = (jx9_real)(ulong)(iVar2 == 0);
      }
      goto LAB_00117dc0;
    }
    pjVar1 = pCtx->pFunc;
    pVm_00 = pCtx->pVm;
    pcVar3 = "Invalid collection name";
  }
  jx9VmThrowError(pVm_00,&pjVar1->sName,1,pcVar3);
  jVar5 = 0.0;
LAB_00117dc0:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar5;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_collection_exists(jx9_context *pCtx,int argc,jx9_value **argv)
{
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Perform the lookup */
	rc = unqliteExistsCollection(pVm, &sName);
	/* Lookup result */
	jx9_result_bool(pCtx, rc == UNQLITE_OK ? 1 : 0);
	return JX9_OK;
}